

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_restore(ASMState *as,IRRef ref)

{
  byte bVar1;
  uint in_ESI;
  ASMState *in_RDI;
  Reg r;
  int32_t ofs;
  IRIns *ir;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  IRIns *as_00;
  undefined4 in_stack_ffffffffffffffe8;
  Reg local_4;
  
  if (in_ESI < 0x8001) {
    local_4 = ra_rematk(in_RDI,in_ESI);
  }
  else {
    as_00 = in_RDI->ir + in_ESI;
    ra_spill((ASMState *)&as_00->field_0,
             (IRIns *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    bVar1 = (as_00->field_1).r;
    local_4 = (Reg)bVar1;
    (as_00->field_1).r = bVar1 | 0x80;
    in_RDI->freeset = 1 << (bVar1 & 0x1f) | in_RDI->freeset;
    if ((in_RDI->weakset >> (bVar1 & 0x1f) & 1) == 0) {
      in_RDI->modset = 1 << (bVar1 & 0x1f) | in_RDI->modset;
      emit_spload(in_RDI,(IRIns *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                  (Reg)((ulong)as_00 >> 0x20),(int32_t)as_00);
    }
  }
  return local_4;
}

Assistant:

static Reg ra_restore(ASMState *as, IRRef ref)
{
  if (emit_canremat(ref)) {
    return ra_rematk(as, ref);
  } else {
    IRIns *ir = IR(ref);
    int32_t ofs = ra_spill(as, ir);  /* Force a spill slot. */
    Reg r = ir->r;
    lua_assert(ra_hasreg(r));
    ra_sethint(ir->r, r);  /* Keep hint. */
    ra_free(as, r);
    if (!rset_test(as->weakset, r)) {  /* Only restore non-weak references. */
      ra_modified(as, r);
      RA_DBGX((as, "restore   $i $r", ir, r));
      emit_spload(as, ir, r, ofs);
    }
    return r;
  }
}